

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::TryFindExtensionInFallbackDatabase
          (DescriptorPool *this,Descriptor *containing_type,int field_number)

{
  int iVar1;
  const_iterator cVar2;
  FileDescriptor *pFVar3;
  bool bVar4;
  FileDescriptorProto file_proto;
  pointer local_100;
  FileDescriptorProto local_f8;
  
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    return false;
  }
  FileDescriptorProto::FileDescriptorProto(&local_f8);
  iVar1 = (*this->fallback_database_->_vptr_DescriptorDatabase[4])
                    (this->fallback_database_,*(undefined8 *)(containing_type + 8),
                     (ulong)(uint)field_number,&local_f8);
  if ((char)iVar1 != '\0') {
    local_100 = ((local_f8.name_.ptr_)->_M_dataplus)._M_p;
    cVar2 = std::
            _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(((this->tables_)._M_t.
                      super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                     _M_head_impl)->files_by_name_)._M_h,&local_100);
    if ((cVar2.
         super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
         ._M_cur == (__node_type *)0x0) ||
       (*(long *)((long)cVar2.
                        super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                        ._M_cur + 0x10) == 0)) {
      pFVar3 = BuildFileFromDatabase(this,&local_f8);
      bVar4 = pFVar3 != (FileDescriptor *)0x0;
      goto LAB_002b8c02;
    }
  }
  bVar4 = false;
LAB_002b8c02:
  FileDescriptorProto::~FileDescriptorProto(&local_f8);
  return bVar4;
}

Assistant:

bool DescriptorPool::TryFindExtensionInFallbackDatabase(
    const Descriptor* containing_type, int field_number) const {
  if (fallback_database_ == nullptr) return false;

  FileDescriptorProto file_proto;
  if (!fallback_database_->FindFileContainingExtension(
          containing_type->full_name(), field_number, &file_proto)) {
    return false;
  }

  if (tables_->FindFile(file_proto.name()) != nullptr) {
    // We've already loaded this file, and it apparently doesn't contain the
    // extension we're looking for.  Some DescriptorDatabases return false
    // positives.
    return false;
  }

  if (BuildFileFromDatabase(file_proto) == nullptr) {
    return false;
  }

  return true;
}